

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Bond * __thiscall
OpenMD::MoleculeCreator::createBond
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BondStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  undefined1 uVar1;
  int index;
  Atom *pAVar2;
  Atom *pAVar3;
  Bond *pBVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  BondStamp *in_RCX;
  BondTypeParser *in_RDX;
  string s;
  Bond *bond;
  OpenMDException *e;
  Atom *atomB;
  Atom *atomA;
  BondType *bondType;
  BondTypeParser btParser;
  Molecule *in_stack_fffffffffffffd68;
  Molecule *in_stack_fffffffffffffd70;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd80;
  BondType *in_stack_fffffffffffffd98;
  errorStruct *in_stack_fffffffffffffda0;
  Atom *in_stack_fffffffffffffda8;
  Bond *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffde0;
  Atom *type;
  uint in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  Bond *local_168;
  BondType local_160 [2];
  string local_140 [32];
  string local_120 [32];
  string local_100 [64];
  BondTypeParser *in_stack_ffffffffffffff40;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  ForceField *in_stack_ffffffffffffff78;
  
  BondTypeParser::BondTypeParser(in_stack_ffffffffffffff40);
  BondStamp::getA(in_RCX);
  pAVar2 = Molecule::getAtomAt(in_stack_fffffffffffffd70,
                               (uint)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  BondStamp::getB(in_RCX);
  pAVar3 = Molecule::getAtomAt(in_stack_fffffffffffffd70,
                               (uint)((ulong)in_stack_fffffffffffffd68 >> 0x20));
  type = pAVar3;
  uVar1 = BondStamp::hasOverride(in_RCX);
  if ((bool)uVar1) {
    BondStamp::getOverrideType_abi_cxx11_((BondStamp *)in_stack_fffffffffffffd68);
    BondStamp::getOverridePars((BondStamp *)in_stack_fffffffffffffd68);
    BondTypeParser::parseTypeAndPars
              (in_RDX,(string *)type,
               (vector<double,_std::allocator<double>_> *)CONCAT17(uVar1,in_stack_fffffffffffffde0))
    ;
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffd80);
    std::__cxx11::string::~string(local_a0);
  }
  else {
    (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(local_100);
    (*(pAVar3->super_StuntDouble)._vptr_StuntDouble[7])(local_120);
    pBVar4 = (Bond *)ForceField::getBondType
                               (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                in_stack_ffffffffffffff68);
    in_stack_fffffffffffffdb0 = pBVar4;
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_100);
    if (pBVar4 == (Bond *)0x0) {
      (*(pAVar2->super_StuntDouble)._vptr_StuntDouble[7])(local_140);
      in_stack_fffffffffffffda8 = (Atom *)std::__cxx11::string::c_str();
      (*(pAVar3->super_StuntDouble)._vptr_StuntDouble[7])(local_160);
      in_stack_fffffffffffffd98 = local_160;
      uVar5 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffda0 = &painCave;
      snprintf(painCave.errMsg,2000,"Can not find Matching Bond Type for[%s, %s]",
               in_stack_fffffffffffffda8,uVar5);
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffd98);
      std::__cxx11::string::~string(local_140);
      in_stack_fffffffffffffda0->isFatal = 1;
      simError();
    }
  }
  pBVar4 = (Bond *)operator_new(0x98);
  Bond::Bond(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,(Atom *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98);
  local_168 = pBVar4;
  index = LocalIndexManager::getNextBondIndex((LocalIndexManager *)0x252c05);
  ShortRangeInteraction::setLocalIndex(&pBVar4->super_ShortRangeInteraction,index);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Molecule::getNBonds((Molecule *)0x252c28);
  OpenMD_itoa_abi_cxx11_(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18);
  pBVar4 = local_168;
  Molecule::getType_abi_cxx11_(in_stack_fffffffffffffd68);
  std::operator+(__lhs,(char *)pBVar4);
  std::__cxx11::string::c_str();
  std::operator+(__lhs,(char *)pBVar4);
  (*(pBVar4->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(pBVar4,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  pBVar4 = local_168;
  std::__cxx11::string::~string(local_188);
  BondTypeParser::~BondTypeParser((BondTypeParser *)0x252d18);
  return pBVar4;
}

Assistant:

Bond* MoleculeCreator::createBond(ForceField* ff, Molecule* mol,
                                    BondStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BondTypeParser btParser;
    BondType* bondType = NULL;
    Atom* atomA;
    Atom* atomB;

    atomA = mol->getAtomAt(stamp->getA());
    atomB = mol->getAtomAt(stamp->getB());

    assert(atomA && atomB);

    if (stamp->hasOverride()) {
      try {
        bondType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                             stamp->getOverridePars());
      } catch (OpenMDException& e) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MoleculeCreator Error: %s "
                 "for molecule %s\n",
                 e.what(), mol->getType().c_str());
        painCave.isFatal = 1;
        simError();
      }

    } else {
      bondType = ff->getBondType(atomA->getType(), atomB->getType());

      if (bondType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Matching Bond Type for[%s, %s]",
                 atomA->getType().c_str(), atomB->getType().c_str());

        painCave.isFatal = 1;
        simError();
      }
    }

    Bond* bond = new Bond(atomA, atomB, bondType);

    // set the local index of this bond, the global index will be set later
    bond->setLocalIndex(localIndexMan->getNextBondIndex());

    // The rule for naming a bond is: MoleculeName_Bond_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bond"
    // The third part is the index of the bond defined in meta-data file
    // For example, Butane_bond_0 is a valid Bond name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBonds(), 10);
    bond->setName(mol->getType() + "_Bond_" + s.c_str());
    return bond;
  }